

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O0

CURLcode get_libcurl_info(void)

{
  int iVar1;
  feature_name_presentp *local_38;
  feature_name_presentp *p_2;
  char **cpp;
  feature_name_presentp *p_1;
  proto_name_tokenp *p;
  char **builtin;
  CURLcode result;
  
  curlinfo = (curl_version_info_data *)curl_version_info(0xb);
  if (curlinfo == (curl_version_info_data *)0x0) {
    builtin._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    if (curlinfo->protocols != (char **)0x0) {
      built_in_protos = curlinfo->protocols;
      for (p = (proto_name_tokenp *)built_in_protos; p->proto_name != (char *)0x0;
          p = (proto_name_tokenp *)&p->proto_tokenp) {
        for (p_1 = (feature_name_presentp *)possibly_built_in; p_1->feature_name != (char *)0x0;
            p_1 = (feature_name_presentp *)&p_1->feature_bitmask) {
          iVar1 = curl_strequal(p_1->feature_name,p->proto_name);
          if (iVar1 != 0) {
            *(char **)p_1->feature_presentp = p->proto_name;
            break;
          }
        }
      }
      proto_count = (long)p - (long)built_in_protos >> 3;
    }
    if ((curlinfo->age < CURLVERSION_ELEVENTH) || (curlinfo->feature_names == (char **)0x0)) {
      p_2 = (feature_name_presentp *)fnames;
      for (cpp = &maybe_feature[0].feature_name; *cpp != (char *)0x0; cpp = cpp + 3) {
        if ((curlinfo->features & *(uint *)(cpp + 2)) != 0) {
          p_2->feature_name = *cpp;
          p_2 = (feature_name_presentp *)&p_2->feature_presentp;
        }
      }
      p_2->feature_name = (char *)0x0;
    }
    else {
      feature_names = curlinfo->feature_names;
    }
    for (p = (proto_name_tokenp *)feature_names; p->proto_name != (char *)0x0;
        p = (proto_name_tokenp *)&p->proto_tokenp) {
      for (local_38 = maybe_feature; local_38->feature_name != (char *)0x0; local_38 = local_38 + 1)
      {
        iVar1 = curl_strequal(local_38->feature_name,p->proto_name);
        if (iVar1 != 0) {
          if (local_38->feature_presentp != (_Bool *)0x0) {
            *local_38->feature_presentp = true;
          }
          break;
        }
      }
      feature_count = feature_count + 1;
    }
    builtin._4_4_ = CURLE_OK;
  }
  return builtin._4_4_;
}

Assistant:

CURLcode get_libcurl_info(void)
{
  CURLcode result = CURLE_OK;
  const char *const *builtin;

  /* Pointer to libcurl's runtime version information */
  curlinfo = curl_version_info(CURLVERSION_NOW);
  if(!curlinfo)
    return CURLE_FAILED_INIT;

  if(curlinfo->protocols) {
    const struct proto_name_tokenp *p;

    built_in_protos = curlinfo->protocols;

    for(builtin = built_in_protos; !result && *builtin; builtin++) {
      /* Identify protocols we are interested in. */
      for(p = possibly_built_in; p->proto_name; p++)
        if(curl_strequal(p->proto_name, *builtin)) {
          *p->proto_tokenp = *builtin;
          break;
        }
    }
    proto_count = builtin - built_in_protos;
  }

  if(curlinfo->age >= CURLVERSION_ELEVENTH && curlinfo->feature_names)
    feature_names = curlinfo->feature_names;
  else {
    const struct feature_name_presentp *p;
    const char **cpp = fnames;

    for(p = maybe_feature; p->feature_name; p++)
      if(curlinfo->features & p->feature_bitmask)
        *cpp++ = p->feature_name;
    *cpp = NULL;
  }

  /* Identify features we are interested in. */
  for(builtin = feature_names; *builtin; builtin++) {
    const struct feature_name_presentp *p;

    for(p = maybe_feature; p->feature_name; p++)
      if(curl_strequal(p->feature_name, *builtin)) {
        if(p->feature_presentp)
          *p->feature_presentp = TRUE;
        break;
      }
    ++feature_count;
  }

  return CURLE_OK;
}